

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.cpp
# Opt level: O3

void __thiscall
duckdb::ValidityData::ValidityData(ValidityData *this,ValidityMask *original,idx_t count)

{
  unsigned_long *puVar1;
  tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_> tVar2;
  ulong uVar3;
  pointer *__ptr;
  ulong uVar4;
  
  puVar1 = (original->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  (this->super_TemplatedValidityData<unsigned_long>).owned_data.
  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> =
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
  uVar4 = count + 0x3f >> 6;
  tVar2.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       operator_new__(uVar4 * 8);
  (this->super_TemplatedValidityData<unsigned_long>).owned_data.
  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> =
       tVar2.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  if (0x3f < count + 0x3f) {
    uVar3 = 0;
    do {
      *(unsigned_long *)
       ((long)tVar2.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + uVar3 * 8) =
           puVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

ValidityData::ValidityData(const ValidityMask &original, idx_t count)
    : TemplatedValidityData(original.GetData(), count) {
}